

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusGF.cpp
# Opt level: O0

void __thiscall ZXing::Pdf417::ModulusGF::ModulusGF(ModulusGF *this,int modulus,int generator)

{
  value_type vVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i_2;
  int i_1;
  int i;
  int x;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  pointer *this_00;
  pointer *__x;
  allocator_type *__a;
  pointer *ppiVar4;
  undefined1 *puVar5;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff82;
  int in_stack_ffffffffffffff84;
  int iVar6;
  ModulusGF *in_stack_ffffffffffffff88;
  ModulusGF *field;
  ModulusPoly *in_stack_ffffffffffffff90;
  ModulusPoly *this_01;
  undefined1 local_3d;
  undefined4 local_3c;
  undefined4 *local_38;
  undefined8 local_30;
  int local_10;
  int local_c;
  
  *(int *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start = in_ESI;
  __x = &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x2ca121);
  __a = (allocator_type *)
        &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x2ca134);
  ppiVar4 = &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
  local_3c = 0;
  local_38 = &local_3c;
  local_30 = 1;
  puVar5 = &local_3d;
  std::allocator<int>::allocator((allocator<int> *)0x2ca17b);
  __l._M_len = (size_type)puVar5;
  __l._M_array = (iterator)ppiVar4;
  std::vector<int,_std::allocator<int>_>::vector(in_RDI,__l,__a);
  ModulusPoly::ModulusPoly
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)));
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff30);
  std::allocator<int>::~allocator((allocator<int> *)0x2ca1d2);
  this_00 = &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  iVar6 = 1;
  field = (ModulusGF *)&stack0xffffffffffffff84;
  this_01 = (ModulusPoly *)0x1;
  std::allocator<int>::allocator((allocator<int> *)0x2ca20a);
  __l_00._M_len = (size_type)puVar5;
  __l_00._M_array = (iterator)ppiVar4;
  std::vector<int,_std::allocator<int>_>::vector(in_RDI,__l_00,__a);
  ModulusPoly::ModulusPoly
            (this_01,field,
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(iVar6,CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80)));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x2ca258);
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_RDI,(size_type)__a,
             (value_type_conflict4 *)__x);
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_RDI,(size_type)__a,
             (value_type_conflict4 *)__x);
  local_88 = 1;
  for (local_8c = 0; local_8c < local_c; local_8c = local_8c + 1) {
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_8c);
    *pvVar3 = (value_type)local_88;
    local_88 = (local_88 * local_10) % local_c;
  }
  for (local_90 = local_c + -1; SBORROW4(local_90,local_c * 2) != local_90 + local_c * -2 < 0;
      local_90 = local_90 + 1) {
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)(local_90 - (local_c + -1)));
    vVar1 = *pvVar3;
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_90);
    *pvVar3 = vVar1;
  }
  for (local_94 = 0; local_94 < local_c + -1; local_94 = local_94 + 1) {
    pvVar2 = in_RDI + 1;
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_94);
    pvVar3 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish,(long)*pvVar3);
    *pvVar3 = (value_type)local_94;
  }
  return;
}

Assistant:

ModulusGF::ModulusGF(int modulus, int generator) :
	_modulus(modulus),
	_zero(*this, { 0 }),
	_one(*this, { 1 })
{
#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	_expTable.resize(modulus * 2, 0);
#else
	_expTable.resize(modulus, 0);
#endif
	_logTable.resize(modulus, 0);
	int x = 1;
	for (int i = 0; i < modulus; i++) {
		_expTable[i] = x;
		x = (x * generator) % modulus;
	}

#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
	for (int i = modulus - 1; i < modulus * 2; ++i)
		_expTable[i] = _expTable[i - (modulus - 1)];
#endif

	for (int i = 0; i < modulus - 1; i++) {
		_logTable[_expTable[i]] = i;
	}
	// logTable[0] == 0 but this should never be used
}